

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

Variable __thiscall runtime::VirtualMachine::popOpStack(VirtualMachine *this)

{
  vector<runtime::Variable,_std::allocator<runtime::Variable>_> *this_00;
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  reference pvVar4;
  Variable VVar5;
  allocator<char> local_81;
  string local_80;
  vector<runtime::Variable,_std::allocator<runtime::Variable>_> *local_60;
  vector<runtime::Variable,_std::allocator<runtime::Variable>_> *opStack;
  allocator<char> local_41;
  string local_40;
  VirtualMachine *local_20;
  VirtualMachine *this_local;
  Variable topOfStack;
  
  local_20 = this;
  bVar1 = std::operator==(&this->stackFrame,(nullptr_t)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"No active stack frame found to pop op stack from!",&local_41);
    panic(this,&local_40);
  }
  peVar2 = std::__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->stackFrame);
  local_60 = &peVar2->opStack;
  bVar1 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::empty(local_60);
  this_00 = local_60;
  if (!bVar1) {
    sVar3 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::size(local_60);
    pvVar4 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                       (this_00,sVar3 - 1);
    this_local = *(VirtualMachine **)pvVar4;
    topOfStack._0_8_ = pvVar4->field_1;
    std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::pop_back(local_60);
    VVar5._0_8_ = (ulong)this_local & 0xffffffff;
    VVar5.field_1 = (anon_union_8_6_52c89740_for_Variable_1)topOfStack._0_8_;
    return VVar5;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Could not pop op stack, it is empty!",&local_81);
  panic(this,&local_80);
}

Assistant:

Variable runtime::VirtualMachine::popOpStack() {
  if (this->stackFrame == nullptr) {
    this->panic("No active stack frame found to pop op stack from!");
  }

  auto opStack = &this->stackFrame->opStack;

  if (opStack->empty()) {
    this->panic("Could not pop op stack, it is empty!");

  } else {
    Variable topOfStack = opStack->at(opStack->size() - 1);
    opStack->pop_back();

    return topOfStack;
  }
}